

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O3

void printAddressingMode(SStream *O,uint pc,cs_m68k *inst,cs_m68k_op *op)

{
  ushort uVar1;
  m68k_op_type mVar2;
  m68k_cpu_size mVar3;
  m68k_reg mVar4;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char *fmt;
  undefined8 uVar10;
  double dVar11;
  
  switch(op->address_mode) {
  case M68K_AM_NONE:
    mVar2 = op->type;
    if (mVar2 != M68K_OP_REG) {
      if (mVar2 == M68K_OP_REG_PAIR) {
        SStream_concat(O,"%s:%s",s_reg_names[(op->field_0).reg + M68K_REG_D0],
                       s_reg_names[(op->field_0).reg_pair.reg_1 + M68K_REG_D0]);
      }
      else if (mVar2 == M68K_OP_REG_BITS) {
        registerBits(O,(cs_m68k_op *)(ulong)op->register_bits);
      }
      goto switchD_002562ce_default;
    }
    pcVar9 = s_reg_names[(op->field_0).reg];
    fmt = "%s";
    goto LAB_0025676e;
  case M68K_AM_REG_DIRECT_DATA:
    uVar8 = (ulong)((op->field_0).reg - M68K_REG_D0);
    pcVar9 = "d%d";
    break;
  case M68K_AM_REG_DIRECT_ADDR:
    uVar8 = (ulong)((op->field_0).reg - M68K_REG_A0);
    pcVar9 = "a%d";
    break;
  case M68K_AM_REGI_ADDR:
    uVar8 = (ulong)((op->field_0).reg - M68K_REG_A0);
    pcVar9 = "(a%d)";
    break;
  case M68K_AM_REGI_ADDR_POST_INC:
    uVar8 = (ulong)((op->field_0).reg - M68K_REG_A0);
    pcVar9 = "(a%d)+";
    break;
  case M68K_AM_REGI_ADDR_PRE_DEC:
    uVar8 = (ulong)((op->field_0).reg - M68K_REG_A0);
    pcVar9 = "-(a%d)";
    break;
  case M68K_AM_REGI_ADDR_DISP:
    uVar1 = (op->mem).disp;
    pcVar9 = anon_var_dwarf_3bac35 + 0x11;
    if ((short)uVar1 < 0) {
      pcVar9 = "-";
    }
    uVar6 = -uVar1;
    if (0 < (short)uVar1) {
      uVar6 = uVar1;
    }
    SStream_concat(O,"%s$%x(a%d)",pcVar9,(ulong)uVar6,(ulong)((op->mem).base_reg - M68K_REG_A0));
    goto switchD_002562ce_default;
  case M68K_AM_AREGI_INDEX_8_BIT_DISP:
    uVar1 = (op->mem).disp;
    pcVar9 = anon_var_dwarf_3bac35 + 0x11;
    if ((short)uVar1 < 0) {
      pcVar9 = "-";
    }
    uVar6 = -uVar1;
    if (0 < (short)uVar1) {
      uVar6 = uVar1;
    }
    uVar10 = 0x6c;
    if ((op->mem).index_size == '\0') {
      uVar10 = 0x77;
    }
    SStream_concat(O,"%s$%x(%s,%s%s.%c)",pcVar9,(ulong)uVar6,s_reg_names[(int)(op->mem).base_reg],
                   " ",s_reg_names[(int)(op->mem).index_reg],uVar10);
    goto switchD_002562ce_default;
  case M68K_AM_AREGI_INDEX_BASE_DISP:
    uVar7 = (op->mem).in_disp;
    if (uVar7 != 0) goto LAB_00256502;
    goto LAB_00256513;
  case M68K_AM_MEMI_POST_INDEX:
  case M68K_AM_MEMI_PRE_INDEX:
  case M68K_AM_PC_MEMI_POST_INDEX:
  case M68K_AM_PC_MEMI_PRE_INDEX:
    SStream_concat(O,"([");
    if ((op->address_mode & ~M68K_AM_REG_DIRECT_DATA) == M68K_AM_PC_MEMI_POST_INDEX) {
      uVar7 = pc + (op->mem).in_disp + 2;
LAB_00256302:
      SStream_concat(O,"$%x",(ulong)uVar7);
    }
    else {
      uVar7 = (op->mem).in_disp;
      if (uVar7 != 0) goto LAB_00256302;
    }
    lVar5 = (long)(int)(op->mem).base_reg;
    if (lVar5 != 0) {
      if ((op->mem).in_disp == 0) {
        SStream_concat(O,"%s",s_reg_names[lVar5]);
      }
      else {
        SStream_concat(O,",%s%s"," ");
      }
    }
    if ((op->address_mode == M68K_AM_PC_MEMI_POST_INDEX) ||
       (op->address_mode == M68K_AM_MEMI_POST_INDEX)) {
      SStream_concat(O,"]");
    }
    lVar5 = (long)(int)(op->mem).index_reg;
    if (lVar5 != 0) {
      uVar10 = 0x6c;
      if ((op->mem).index_size == '\0') {
        uVar10 = 0x77;
      }
      SStream_concat(O,",%s%s.%c"," ",s_reg_names[lVar5],uVar10);
    }
    if ((op->mem).scale != '\0') {
      SStream_concat(O,"%s*%s%d"," ");
    }
    if ((op->address_mode == M68K_AM_PC_MEMI_PRE_INDEX) ||
       (op->address_mode == M68K_AM_MEMI_PRE_INDEX)) {
      SStream_concat(O,"]");
    }
    if ((op->mem).out_disp != 0) {
      SStream_concat(O,",%s$%x"," ");
    }
    goto LAB_0025670d;
  case M68K_AM_PCI_DISP:
    uVar8 = (ulong)(pc + (int)(op->mem).disp + 2);
    pcVar9 = "$%x(pc)";
    break;
  case M68K_AM_PCI_INDEX_8_BIT_DISP:
    uVar10 = 0x6c;
    if ((op->mem).index_size == '\0') {
      uVar10 = 0x77;
    }
    SStream_concat(O,"$%x(pc,%s%s.%c)",(ulong)(pc + (int)(op->mem).disp + 2)," ",
                   s_reg_names[(int)(op->mem).index_reg],uVar10);
    goto switchD_002562ce_default;
  case M68K_AM_PCI_INDEX_BASE_DISP:
    uVar7 = pc + (op->mem).in_disp + 2;
LAB_00256502:
    SStream_concat(O,"$%x",(ulong)uVar7);
LAB_00256513:
    SStream_concat(O,"(");
    if (op->address_mode == M68K_AM_PCI_INDEX_BASE_DISP) {
      pcVar9 = "pc,%s.%c";
    }
    else {
      mVar4 = (op->mem).base_reg;
      pcVar9 = "%s.%c";
      if (mVar4 != M68K_REG_INVALID) {
        SStream_concat(O,"a%d,%s",(ulong)(mVar4 - M68K_REG_A0)," ");
      }
    }
    uVar10 = 0x6c;
    if ((op->mem).index_size == '\0') {
      uVar10 = 0x77;
    }
    SStream_concat(O,pcVar9,s_reg_names[(int)(op->mem).index_reg],uVar10);
    if ((op->mem).scale == '\0') {
LAB_0025670d:
      pcVar9 = ")";
LAB_00256714:
      SStream_concat(O,pcVar9);
    }
    else {
      SStream_concat(O,"%s*%s%d)"," ");
    }
    goto switchD_002562ce_default;
  case M68K_AM_ABSOLUTE_DATA_SHORT:
    pcVar9 = (char *)(op->field_0).imm;
    fmt = "$%x.w";
    goto LAB_0025676e;
  case M68K_AM_ABSOLUTE_DATA_LONG:
    pcVar9 = (char *)(op->field_0).imm;
    fmt = "$%x.l";
LAB_0025676e:
    SStream_concat(O,fmt,pcVar9);
    goto switchD_002562ce_default;
  case M68K_AM_IMMEDIATE:
    if ((inst->op_size).type != M68K_SIZE_TYPE_FPU) {
      pcVar9 = (char *)(op->field_0).imm;
      fmt = "#$%x";
      goto LAB_0025676e;
    }
    mVar3 = (inst->op_size).field_1.cpu_size;
    if (mVar3 == 8) {
      dVar11 = (double)(op->field_0).imm;
LAB_002567aa:
      SStream_concat(O,"#%f",dVar11);
      goto switchD_002562ce_default;
    }
    if (mVar3 == M68K_CPU_SIZE_LONG) {
      dVar11 = (double)(op->field_0).simm;
      goto LAB_002567aa;
    }
    pcVar9 = "#<unsupported>";
    goto LAB_00256714;
  case M68K_AM_BRANCH_DISPLACEMENT:
    uVar8 = (ulong)(pc + (op->br_disp).disp + 2);
    pcVar9 = "$%x";
    break;
  default:
    goto switchD_002562ce_default;
  }
  SStream_concat(O,pcVar9,uVar8);
switchD_002562ce_default:
  if ((op->mem).bitfield == '\0') {
    return;
  }
  SStream_concat(O,"{%d:%d}",(ulong)(op->mem).offset,(ulong)(op->mem).width);
  return;
}

Assistant:

static void printAddressingMode(SStream* O, unsigned int pc, const cs_m68k* inst, const cs_m68k_op* op)
{
	switch (op->address_mode) {
		case M68K_AM_NONE:
			switch (op->type) {
				case M68K_OP_REG_BITS:
					registerBits(O, op);
					break;
				case M68K_OP_REG_PAIR:
					registerPair(O, op);
					break;
				case M68K_OP_REG:
					SStream_concat(O, "%s", s_reg_names[op->reg]);
					break;
				default:
					break;
			}
			break;

		case M68K_AM_REG_DIRECT_DATA: SStream_concat(O, "d%d", (op->reg - M68K_REG_D0)); break;
		case M68K_AM_REG_DIRECT_ADDR: SStream_concat(O, "a%d", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR: SStream_concat(O, "(a%d)", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR_POST_INC: SStream_concat(O, "(a%d)+", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR_PRE_DEC: SStream_concat(O, "-(a%d)", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR_DISP: SStream_concat(O, "%s$%x(a%d)", op->mem.disp < 0 ? "-" : "", abs(op->mem.disp), (op->mem.base_reg - M68K_REG_A0)); break;
		case M68K_AM_PCI_DISP: SStream_concat(O, "$%x(pc)", pc + 2 + op->mem.disp); break;
		case M68K_AM_ABSOLUTE_DATA_SHORT: SStream_concat(O, "$%x.w", op->imm); break;
		case M68K_AM_ABSOLUTE_DATA_LONG: SStream_concat(O, "$%x.l", op->imm); break;
		case M68K_AM_IMMEDIATE:
			 if (inst->op_size.type == M68K_SIZE_TYPE_FPU) {
#if defined(_KERNEL_MODE)
				 // Issue #681: Windows kernel does not support formatting float point
				 SStream_concat(O, "#<float_point_unsupported>");
				 break;
#else
				 if (inst->op_size.fpu_size == M68K_FPU_SIZE_SINGLE)
					 SStream_concat(O, "#%f", op->simm);
				 else if (inst->op_size.fpu_size == M68K_FPU_SIZE_DOUBLE)
					 SStream_concat(O, "#%f", op->dimm);
				 else
					 SStream_concat(O, "#<unsupported>");
				 break;
#endif
			 }
			 SStream_concat(O, "#$%x", op->imm);
			 break;
		case M68K_AM_PCI_INDEX_8_BIT_DISP:
			SStream_concat(O, "$%x(pc,%s%s.%c)", pc + 2 + op->mem.disp, s_spacing, getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			break;
		case M68K_AM_AREGI_INDEX_8_BIT_DISP:
			SStream_concat(O, "%s$%x(%s,%s%s.%c)", op->mem.disp < 0 ? "-" : "", abs(op->mem.disp), getRegName(op->mem.base_reg), s_spacing, getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			break;
		case M68K_AM_PCI_INDEX_BASE_DISP:
		case M68K_AM_AREGI_INDEX_BASE_DISP:

			if (op->address_mode == M68K_AM_PCI_INDEX_BASE_DISP) {
				SStream_concat(O, "$%x", pc + 2 + op->mem.in_disp);
			} else {
				if (op->mem.in_disp > 0)
					SStream_concat(O, "$%x", op->mem.in_disp);
			}

			SStream_concat(O, "(");

			if (op->address_mode == M68K_AM_PCI_INDEX_BASE_DISP) {
			    SStream_concat(O, "pc,%s.%c", getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			} else {
				if (op->mem.base_reg != M68K_REG_INVALID)
					SStream_concat(O, "a%d,%s", op->mem.base_reg - M68K_REG_A0, s_spacing);
				SStream_concat(O, "%s.%c", getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			}

			if (op->mem.scale > 0)
			    SStream_concat(O, "%s*%s%d)", s_spacing, s_spacing, op->mem.scale);
			else
			    SStream_concat(O, ")");
			break;
			// It's ok to just use PCMI here as is as we set base_reg to PC in the disassembler. While this is not strictly correct it makes the code
			// easier and that is what actually happens when the code is executed anyway.

		case M68K_AM_PC_MEMI_POST_INDEX:
		case M68K_AM_PC_MEMI_PRE_INDEX:
		case M68K_AM_MEMI_PRE_INDEX:
		case M68K_AM_MEMI_POST_INDEX:
			SStream_concat(O, "([");

			if (op->address_mode == M68K_AM_PC_MEMI_POST_INDEX || op->address_mode == M68K_AM_PC_MEMI_PRE_INDEX) {
				SStream_concat(O, "$%x", pc + 2 + op->mem.in_disp);
			} else {
				if (op->mem.in_disp > 0)
					SStream_concat(O, "$%x", op->mem.in_disp);
			}

			if (op->mem.base_reg != M68K_REG_INVALID) {
				if (op->mem.in_disp > 0)
					SStream_concat(O, ",%s%s", s_spacing, getRegName(op->mem.base_reg));
				else
					SStream_concat(O, "%s", getRegName(op->mem.base_reg));
			}

			if (op->address_mode == M68K_AM_MEMI_POST_INDEX || op->address_mode == M68K_AM_PC_MEMI_POST_INDEX)
			    SStream_concat(O, "]");

			if (op->mem.index_reg != M68K_REG_INVALID)
			    SStream_concat(O, ",%s%s.%c", s_spacing, getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');

			if (op->mem.scale > 0)
			    SStream_concat(O, "%s*%s%d", s_spacing, s_spacing, op->mem.scale);

			if (op->address_mode == M68K_AM_MEMI_PRE_INDEX || op->address_mode == M68K_AM_PC_MEMI_PRE_INDEX)
			    SStream_concat(O, "]");

			if (op->mem.out_disp > 0)
			    SStream_concat(O, ",%s$%x", s_spacing, op->mem.out_disp);

			SStream_concat(O, ")");
			break;
		case M68K_AM_BRANCH_DISPLACEMENT:
			SStream_concat(O, "$%x", pc + 2 + op->br_disp.disp);
		default:
			break;
	}

	if (op->mem.bitfield)
		SStream_concat(O, "{%d:%d}", op->mem.offset, op->mem.width);
}